

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderbuffers.cpp
# Opt level: O1

void __thiscall FGLRenderBuffers::CreateBloom(FGLRenderBuffers *this,int width,int height)

{
  uint uVar1;
  int iVar2;
  GLuint GVar3;
  long lVar4;
  FGLRenderBuffers *pFVar5;
  ulong uVar6;
  
  ClearBloom(this);
  if (0 < height && 0 < width) {
    uVar6 = (ulong)((uint)width >> 1);
    if ((uint)width >> 1 < 2) {
      uVar6 = 1;
    }
    uVar1 = (uint)height >> 1;
    if ((uint)height >> 1 < 2) {
      uVar1 = 1;
    }
    lVar4 = 0x14;
    do {
      iVar2 = (int)(uVar6 >> 0x1f) + (int)uVar6 >> 1;
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      *(int *)((long)this->BloomLevels + lVar4 + -4) = iVar2;
      iVar2 = (int)uVar1 / 2;
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      *(int *)((long)&this->BloomLevels[0].VTexture + lVar4) = iVar2;
      pFVar5 = (FGLRenderBuffers *)&stack0xffffffffffffffc8;
      FString::FString((FString *)&stack0xffffffffffffffc8,"Bloom.VTexture");
      GVar3 = Create2DTexture(pFVar5,(FString *)&stack0xffffffffffffffc8,0x881a,
                              *(int *)((long)this->BloomLevels + lVar4 + -4),
                              *(int *)((long)&this->BloomLevels[0].VTexture + lVar4));
      *(GLuint *)((long)this->BloomLevels + lVar4 + -0x14) = GVar3;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      pFVar5 = (FGLRenderBuffers *)&stack0xffffffffffffffc8;
      FString::FString((FString *)&stack0xffffffffffffffc8,"Bloom.HTexture");
      GVar3 = Create2DTexture(pFVar5,(FString *)&stack0xffffffffffffffc8,0x881a,
                              *(int *)((long)this->BloomLevels + lVar4 + -4),
                              *(int *)((long)&this->BloomLevels[0].VTexture + lVar4));
      *(GLuint *)((long)this->BloomLevels + lVar4 + -0xc) = GVar3;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      FString::FString((FString *)&stack0xffffffffffffffc8,"Bloom.VFramebuffer");
      GVar3 = CreateFrameBuffer(this,(FString *)&stack0xffffffffffffffc8,
                                *(GLuint *)((long)this->BloomLevels + lVar4 + -0x14));
      *(GLuint *)((long)this->BloomLevels + lVar4 + -0x10) = GVar3;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      FString::FString((FString *)&stack0xffffffffffffffc8,"Bloom.HFramebuffer");
      GVar3 = CreateFrameBuffer(this,(FString *)&stack0xffffffffffffffc8,
                                *(GLuint *)((long)this->BloomLevels + lVar4 + -0xc));
      *(GLuint *)((long)this->BloomLevels + lVar4 + -8) = GVar3;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      uVar6 = (ulong)*(uint *)((long)this->BloomLevels + lVar4 + -4);
      uVar1 = *(uint *)((long)&this->BloomLevels[0].VTexture + lVar4);
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x74);
  }
  return;
}

Assistant:

void FGLRenderBuffers::CreateBloom(int width, int height)
{
	ClearBloom();
	
	// No scene, no bloom!
	if (width <= 0 || height <= 0)
		return;

	int bloomWidth = MAX(width / 2, 1);
	int bloomHeight = MAX(height / 2, 1);
	for (int i = 0; i < NumBloomLevels; i++)
	{
		auto &level = BloomLevels[i];
		level.Width = MAX(bloomWidth / 2, 1);
		level.Height = MAX(bloomHeight / 2, 1);

		level.VTexture = Create2DTexture("Bloom.VTexture", GL_RGBA16F, level.Width, level.Height);
		level.HTexture = Create2DTexture("Bloom.HTexture", GL_RGBA16F, level.Width, level.Height);
		level.VFramebuffer = CreateFrameBuffer("Bloom.VFramebuffer", level.VTexture);
		level.HFramebuffer = CreateFrameBuffer("Bloom.HFramebuffer", level.HTexture);

		bloomWidth = level.Width;
		bloomHeight = level.Height;
	}
}